

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JFSON.cpp
# Opt level: O1

bool __thiscall JFSON::Json::has_shape(Json *this,shape *types,string *err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  element_type *peVar3;
  iterator ppVar4;
  iterator ppVar5;
  int iVar6;
  Type TVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar8;
  undefined8 *puVar9;
  ulong *puVar10;
  long *plVar11;
  undefined8 uVar12;
  long lVar13;
  iterator __rhs;
  bool bVar14;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  iVar6 = (**((this->m_ptr).super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->_vptr_JsonValue)();
  if (iVar6 != 5) {
    dump_abi_cxx11_(&local_88,this);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,0x109323);
    plVar11 = plVar8 + 2;
    if ((long *)*plVar8 == plVar11) {
      local_98 = *plVar11;
      lStack_90 = plVar8[3];
      local_a8 = &local_98;
    }
    else {
      local_98 = *plVar11;
      local_a8 = (long *)*plVar8;
    }
    local_a0 = plVar8[1];
    *plVar8 = (long)plVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::operator=((string *)err,(string *)&local_a8);
    if (local_a8 != &local_98) {
      operator_delete(local_a8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    return false;
  }
  sVar2 = types->_M_len;
  bVar14 = sVar2 == 0;
  if (bVar14) {
    return bVar14;
  }
  __rhs = types->_M_array;
  peVar3 = (this->m_ptr).super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar6 = (*peVar3->_vptr_JsonValue[0xb])(peVar3,__rhs);
  TVar7 = (**(code **)**(undefined8 **)CONCAT44(extraout_var,iVar6))();
  if (TVar7 == __rhs->second) {
    lVar13 = sVar2 * 0x28;
    ppVar4 = __rhs;
    do {
      __rhs = ppVar4 + 1;
      lVar13 = lVar13 + -0x28;
      bVar14 = lVar13 == 0;
      if (bVar14) {
        return bVar14;
      }
      peVar3 = (this->m_ptr).super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      iVar6 = (*peVar3->_vptr_JsonValue[0xb])(peVar3,__rhs);
      TVar7 = (**(code **)**(undefined8 **)CONCAT44(extraout_var_00,iVar6))();
      ppVar5 = ppVar4 + 1;
      ppVar4 = __rhs;
    } while (TVar7 == ppVar5->second);
  }
  std::operator+(&local_48,"bad type for ",&__rhs->first);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_48);
  paVar1 = &local_88.field_2;
  puVar10 = (ulong *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_88.field_2._M_allocated_capacity = *puVar10;
    local_88.field_2._8_8_ = plVar8[3];
    local_88._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_88.field_2._M_allocated_capacity = *puVar10;
    local_88._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_88._M_string_length = plVar8[1];
  *plVar8 = (long)puVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  dump_abi_cxx11_(&local_68,this);
  uVar12 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    uVar12 = local_88.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar12 < local_68._M_string_length + local_88._M_string_length) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      uVar12 = local_68.field_2._M_allocated_capacity;
    }
    if (local_68._M_string_length + local_88._M_string_length <= (ulong)uVar12) {
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_68,0,(char *)0x0,(ulong)local_88._M_dataplus._M_p);
      goto LAB_0010644e;
    }
  }
  puVar9 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_68._M_dataplus._M_p);
LAB_0010644e:
  local_a8 = &local_98;
  plVar8 = puVar9 + 2;
  if ((long *)*puVar9 == plVar8) {
    local_98 = *plVar8;
    lStack_90 = puVar9[3];
  }
  else {
    local_98 = *plVar8;
    local_a8 = (long *)*puVar9;
  }
  local_a0 = puVar9[1];
  *puVar9 = plVar8;
  puVar9[1] = 0;
  *(undefined1 *)plVar8 = 0;
  std::__cxx11::string::operator=((string *)err,(string *)&local_a8);
  if (local_a8 != &local_98) {
    operator_delete(local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return bVar14;
}

Assistant:

bool Json::has_shape(const shape & types, string & err) const {
    if (!is_object()) {
        err = "expected JSON object, got " + dump();
        return false;
    }

    for (auto & item : types) {
        if ((*this)[item.first].type() != item.second) {
            err = "bad type for " + item.first + " in " + dump();
            return false;
        }
    }

    return true;
}